

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O3

int rfc7181_metric_encode(rfc7181_metric_field *encoded,uint32_t decoded)

{
  bool bVar1;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint8_t uVar6;
  
  iVar3 = -1;
  if (0xff000001 < decoded - 0xffffff) {
    if (decoded < 0xffff01) {
      uVar4 = decoded + 0x100;
      uVar2 = '\0';
      uVar6 = '\0';
      uVar5 = uVar4;
      if (0x100 < decoded) {
        do {
          uVar6 = uVar2 + '\x01';
          uVar5 = uVar4 + 1 >> 1;
          bVar1 = 0x400 < uVar4;
          uVar4 = uVar5;
          uVar2 = uVar6;
        } while (bVar1);
      }
      uVar2 = (char)uVar5 + 0xff;
    }
    else {
      uVar2 = 0xff;
      uVar6 = '\x0f';
    }
    encoded->b[0] = uVar6;
    encoded->b[1] = uVar2;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
rfc7181_metric_encode(struct rfc7181_metric_field *encoded, uint32_t decoded) {
  uint8_t a, b;
  /*
   * metric-value := (257+b)2^a - 256
   * metric-code := 256 * a + b
   */

  if (decoded < RFC7181_METRIC_MIN || decoded >= RFC7181_METRIC_INFINITE) {
    return -1;
  }
  if (decoded > RFC7181_METRIC_MAX) {
    encoded->b[0] = 0x0f;
    encoded->b[1] = 0xff;
    return 0;
  }

  /* metric-value + 256 = (257+b)<<a */
  decoded += 256;

  a = 0;
  while (decoded > 512) {
    a++;

    /* divide by 2 and round up */
    decoded++;
    decoded >>= 1;
  }

  b = decoded - 257;

  encoded->b[0] = a;
  encoded->b[1] = b;

  return 0;
}